

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitu.c
# Opt level: O3

void u_slow_down(void)

{
  char *line;
  
  u.uprops[0x1a].intrinsic = 0;
  line = "Your quickness feels less natural.";
  if (u.uprops[0x1a].extrinsic == 0) {
    line = "You slow down.";
  }
  pline(line);
  exercise(3,'\0');
  return;
}

Assistant:

void u_slow_down(void)
{
	HFast = 0L;
	if (!Fast)
	    pline("You slow down.");
	else	/* speed boots */
	    pline("Your quickness feels less natural.");
	exercise(A_DEX, FALSE);
}